

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

ctmbstr tidyOptGetNextDeclTag(TidyDoc tdoc,TidyOptionId optId,TidyIterator *iter)

{
  ctmbstr ptVar1;
  
  if (tdoc != (TidyDoc)0x0) {
    if ((int)optId < 0x27) {
      if (optId == TidyBlockTags) {
        ptVar1 = prvTidyGetNextDeclaredTag((TidyDocImpl *)tdoc,tagtype_block,iter);
        return ptVar1;
      }
      if (optId == TidyEmptyTags) {
        ptVar1 = prvTidyGetNextDeclaredTag((TidyDocImpl *)tdoc,tagtype_empty,iter);
        return ptVar1;
      }
    }
    else {
      if (optId == TidyInlineTags) {
        ptVar1 = prvTidyGetNextDeclaredTag((TidyDocImpl *)tdoc,tagtype_inline,iter);
        return ptVar1;
      }
      if (optId == TidyPreTags) {
        ptVar1 = prvTidyGetNextDeclaredTag((TidyDocImpl *)tdoc,tagtype_pre,iter);
        return ptVar1;
      }
    }
  }
  return (ctmbstr)0x0;
}

Assistant:

ctmbstr TIDY_CALL       tidyOptGetNextDeclTag( TidyDoc tdoc, TidyOptionId optId,
                                     TidyIterator* iter )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ctmbstr tagnam = NULL;
    if ( impl )
    {
        UserTagType tagtyp = tagtype_null;
        if ( optId == TidyInlineTags )
            tagtyp = tagtype_inline;
        else if ( optId == TidyBlockTags )
            tagtyp = tagtype_block;
        else if ( optId == TidyEmptyTags )
            tagtyp = tagtype_empty;
        else if ( optId == TidyPreTags )
            tagtyp = tagtype_pre;
        if ( tagtyp != tagtype_null )
            tagnam = TY_(GetNextDeclaredTag)( impl, tagtyp, iter );
    }
    return tagnam;
}